

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void flatbuffers::tests::FieldIdentifierTest(void)

{
  bool bVar1;
  IDLOptions IStack_a98;
  Parser local_788;
  
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:0); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ f: int (id:0); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38c,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:text); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:text); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38e,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:\"text\"); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:\\\"text\\\"); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x38f,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:0text); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:0text); }\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x390,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:1.0); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,"\'false\' != \'Parser().Parse(\"table T{ f: int (id:1.0); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x391,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:-1); g: int (id:0); }",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:-1); g: int (id:0); }\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x392,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ f: int (id:129496726); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"table T{ f: int (id:129496726); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x393,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"union X{} table T{ u: X(id:0); table F{x:int;\n}",(char **)0x0,
                        (char *)0x0);
  TestEq<bool,bool>(false,bVar1,
                    "\'false\' != \'Parser().Parse(\"union X{} table T{ u: X(id:0); table F{x:int;\\n}\")\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x396,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"union X{} table T{ u: X (id:1); }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'Parser().Parse(\"union X{} table T{ u: X (id:1); }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x398,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"union X{} table T{ u: X; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"union X{} table T{ u: X; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x399,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ nan: string; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ nan: string; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39b,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ inf: string; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ inf: string; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39c,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ inf: float = inf; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ inf: float = inf; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39e,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  IDLOptions::IDLOptions(&IStack_a98);
  Parser::Parser(&local_788,&IStack_a98);
  bVar1 = Parser::Parse(&local_788,"table T{ nan: float = inf; }",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'Parser().Parse(\"table T{ nan: float = inf; }\")\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x39f,"");
  Parser::~Parser(&local_788);
  IDLOptions::~IDLOptions(&IStack_a98);
  return;
}

Assistant:

void FieldIdentifierTest() {
  using flatbuffers::Parser;
  TEST_EQ(true, Parser().Parse("table T{ f: int (id:0); }"));
  // non-integer `id` should be rejected
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:text); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:\"text\"); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:0text); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:1.0); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:-1); g: int (id:0); }"));
  TEST_EQ(false, Parser().Parse("table T{ f: int (id:129496726); }"));
  // A unuion filed occupys two ids: enumerator + pointer (offset).
  TEST_EQ(false,
          Parser().Parse("union X{} table T{ u: X(id:0); table F{x:int;\n}"));
  // Positive tests for unions
  TEST_EQ(true, Parser().Parse("union X{} table T{ u: X (id:1); }"));
  TEST_EQ(true, Parser().Parse("union X{} table T{ u: X; }"));
  // Test using 'inf' and 'nan' words both as identifiers and as default values.
  TEST_EQ(true, Parser().Parse("table T{ nan: string; }"));
  TEST_EQ(true, Parser().Parse("table T{ inf: string; }"));
#if defined(FLATBUFFERS_HAS_NEW_STRTOD) && (FLATBUFFERS_HAS_NEW_STRTOD > 0)
  TEST_EQ(true, Parser().Parse("table T{ inf: float = inf; }"));
  TEST_EQ(true, Parser().Parse("table T{ nan: float = inf; }"));
#endif
}